

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

iterator * __thiscall
google::
sparse_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::sparse_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::sparse_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
::emplace_at<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<A&&>>
          (iterator *__return_storage_ptr__,
          sparse_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::sparse_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::sparse_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
          *this,size_type pos,piecewise_construct_t *args,tuple<int_&&> *args_1,tuple<A_&&> *args_2)

{
  ushort uVar1;
  sparsegroup<std::pair<const_int,_A>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *psVar2;
  sparsegroup<std::pair<const_int,_A>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *psVar3;
  bool bVar4;
  length_error *this_00;
  long lVar5;
  nonempty_iterator local_50;
  
  if ((ulong)(*(long *)(this + 0x50) - *(long *)(this + 0x28)) < 0x1fffffffffffffff) {
    bVar4 = sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
            ::test_deleted((sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                            *)this,pos);
    if (bVar4) {
      *(long *)(this + 0x28) = *(long *)(this + 0x28) + -1;
    }
    lVar5 = (pos / 0x30) * 0x10;
    uVar1 = *(ushort *)(*(long *)(this + 0x30) + 8 + lVar5);
    sparsegroup<std::pair<int_const,A>,(unsigned_short)48,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
    ::set_inplace<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<A&&>>
              ((sparsegroup<std::pair<int_const,A>,(unsigned_short)48,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                *)(*(long *)(this + 0x30) + lVar5),(short)pos + (short)(pos / 0x30) * -0x30,args,
               args_1,args_2);
    *(ulong *)(this + 0x50) =
         *(long *)(this + 0x50) +
         ((ulong)*(ushort *)(*(long *)(this + 0x30) + 8 + lVar5) - (ulong)uVar1);
    sparsetable<std::pair<const_int,_A>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
    ::get_iter(&local_50,
               (sparsetable<std::pair<const_int,_A>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                *)(this + 0x30),pos);
    psVar2 = *(sparsegroup<std::pair<const_int,_A>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
               **)(this + 0x30);
    psVar3 = *(sparsegroup<std::pair<const_int,_A>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
               **)(this + 0x38);
    (__return_storage_ptr__->pos).row_current._M_current = local_50.row_current._M_current;
    (__return_storage_ptr__->pos).col_current = local_50.col_current;
    (__return_storage_ptr__->pos).row_begin._M_current = local_50.row_begin._M_current;
    (__return_storage_ptr__->pos).row_end._M_current = local_50.row_end._M_current;
    __return_storage_ptr__->ht =
         (sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
          *)this;
    (__return_storage_ptr__->end).row_begin._M_current = psVar2;
    (__return_storage_ptr__->end).row_end._M_current = psVar3;
    (__return_storage_ptr__->end).row_current._M_current = psVar3;
    (__return_storage_ptr__->end).col_current = (nonempty_iterator)0x0;
    sparse_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
    ::advance_past_deleted(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

iterator emplace_at(size_type pos, Args&&... args) {
    if (size() >= max_size()) {
      throw std::length_error("insert overflow");
    }
    if (test_deleted(pos)) {  // just replace if it's been deleted
      // The set() below will undelete this object.  We just worry about
      // stats
      assert(num_deleted > 0);
      --num_deleted;  // used to be, now it isn't
    }
    table.set_inplace(pos, std::forward<Args>(args)...);
    return iterator(this, table.get_iter(pos), table.nonempty_end());
  }